

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

float __thiscall ODDLParser::Value::getFloat(Value *this)

{
  float local_1c;
  float tmp;
  float v;
  Value *this_local;
  
  if (this->m_type == ddl_float) {
    _tmp = this;
    memcpy(&local_1c,this->m_data,this->m_size);
    this_local._4_4_ = local_1c;
  }
  else {
    this_local._4_4_ = *(float *)this->m_data;
  }
  return this_local._4_4_;
}

Assistant:

float Value::getFloat() const {
    if( m_type == ddl_float ) {
        float v;
        ::memcpy( &v, m_data, m_size );
        return ( float ) v;
    } else {
        float tmp;
        ::memcpy( &tmp, m_data, 4 );
        return ( float ) tmp;
    }
}